

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall Game::Run(Game *this,Renderer *renderer,size_t target_frame_duration,int level)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer ptVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Obstacle *o_1;
  Car *pCVar7;
  pointer pOVar8;
  undefined4 in_register_0000000c;
  thread *t;
  long lVar9;
  pointer ptVar10;
  undefined1 auVar11 [8];
  int iVar12;
  Obstacle *o;
  pointer pOVar13;
  thread *c;
  Game *pGVar14;
  initializer_list<std::shared_ptr<Car>_> __l;
  bool running;
  string direction;
  shared_ptr<Car> car2;
  shared_ptr<Car> car1;
  vector<std::thread,_std::allocator<std::thread>_> cars;
  vector<Obstacle,_std::allocator<Obstacle>_> obstacles;
  vector<std::thread,_std::allocator<std::thread>_> obstacleThreads;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> carObjects;
  bool local_209;
  thread local_208;
  thread local_200;
  char *local_1f8;
  long local_1f0 [2];
  shared_ptr<Car> local_1e0;
  shared_ptr<Car> local_1d0;
  int local_1bc;
  vector<std::thread,_std::allocator<std::thread>_> local_1b8;
  vector<Obstacle,_std::allocator<Obstacle>_> local_198;
  undefined8 local_178;
  Game *local_170;
  size_t local_168;
  Renderer *local_160;
  shared_ptr<Car> local_158;
  shared_ptr<Car> local_148;
  string local_138;
  undefined1 local_118 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  Car *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> local_d8;
  pointer local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> local_78;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> local_60;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> local_48;
  
  local_178 = CONCAT44(in_register_0000000c,level);
  local_170 = this;
  local_168 = target_frame_duration;
  local_160 = renderer;
  local_1bc = SDL_GetTicks();
  local_209 = true;
  pCVar7 = (Car *)operator_new(0x68);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"horizontal","");
  pCVar7->_xpos = 0x1d6;
  pCVar7->_ypos = 0x1fe;
  pCVar7->_delay = 0x19;
  pCVar7->_active = true;
  pCVar7->_speed = -1;
  pCVar7->_limit = 0x280;
  (pCVar7->_axis)._M_dataplus._M_p = (pointer)&(pCVar7->_axis).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar7->_axis,local_98,local_90 + (long)local_98);
  pCVar7->_succeeded = false;
  (pCVar7->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pCVar7->mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pCVar7->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (pCVar7->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (pCVar7->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar7;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Car*>
            (&local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pCVar7);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  pCVar7 = (Car *)operator_new(0x68);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"vertical","");
  pCVar7->_xpos = 0x25d;
  pCVar7->_ypos = 0x203;
  pCVar7->_delay = 0x19;
  pCVar7->_active = true;
  pCVar7->_speed = -1;
  pCVar7->_limit = 0x280;
  (pCVar7->_axis)._M_dataplus._M_p = (pointer)&(pCVar7->_axis).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar7->_axis,local_b8,local_b0 + (long)local_b8);
  pCVar7->_succeeded = false;
  (pCVar7->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pCVar7->mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pCVar7->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (pCVar7->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (pCVar7->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar7;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Car*>
            (&local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pCVar7);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = (undefined1  [8])Car::move;
  _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
            (&local_200,(offset_in_Car_to_subr *)local_118,&local_1d0);
  std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
            (&local_1b8,&local_200);
  ptVar2 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_200._M_id._M_thread == 0) {
    local_118 = (undefined1  [8])Car::move;
    _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
              (&local_200,(offset_in_Car_to_subr *)local_118,&local_1e0);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&local_1b8,&local_200);
    ptVar2 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_200._M_id._M_thread == 0) {
      local_118 = (undefined1  [8])
                  local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Stack_110._M_pi =
           local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_108 = local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_100 = local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      __l._M_len = 2;
      __l._M_array = (iterator)local_118;
      std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
                (&local_78,__l,(allocator_type *)&local_200);
      lVar9 = 0x20;
      do {
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_118 + lVar9 + -8) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_118 + lVar9 + -8));
        }
        lVar9 = lVar9 + -0x10;
      } while (lVar9 != 0);
      local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0 < (int)local_178) {
        iVar12 = (int)local_178 * 3;
        if ((int)local_178 * 3 < 2) {
          iVar12 = 1;
        }
        do {
          iVar4 = Randomizer::genRand<int>(1,600);
          iVar5 = Randomizer::genRand<int>(1,600);
          iVar6 = Randomizer::genRand<int>(1,2);
          local_200._M_id._M_thread = (id)local_1f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"vertical","");
          if (iVar6 == 1) {
            std::__cxx11::string::_M_replace((ulong)&local_200,0,local_1f8,0x108130);
          }
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,local_200._M_id._M_thread,
                     local_1f8 + (long)local_200._M_id._M_thread);
          std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
                    (&local_48,&local_78);
          Obstacle::Obstacle((Obstacle *)local_118,iVar4,iVar5,600,1,&local_138,&local_48);
          std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector
                    (&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          std::vector<Obstacle,_std::allocator<Obstacle>_>::emplace_back<Obstacle>
                    (&local_198,(Obstacle *)local_118);
          std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector
                    (&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_p != &local_e8) {
            operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
          }
          if (local_200._M_id._M_thread != (id)local_1f0) {
            operator_delete((void *)local_200._M_id._M_thread,local_1f0[0] + 1);
          }
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      pOVar8 = local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_118 = (undefined1  [8])0x0;
      _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_108 = (Car *)0x0;
      if (local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pOVar13 = local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_200._M_id._M_thread = (id)Obstacle::move;
          local_1f8 = (char *)0x0;
          local_c0 = pOVar13;
          std::thread::thread<void(Obstacle::*)(),Obstacle*,void>
                    (&local_208,(offset_in_Obstacle_to_subr *)&local_200,&local_c0);
          std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                    ((vector<std::thread,_std::allocator<std::thread>_> *)local_118,&local_208);
          ptVar2 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_208._M_id._M_thread != 0) goto LAB_0010486c;
          pOVar13 = pOVar13 + 1;
        } while (pOVar13 != pOVar8);
      }
      pOVar8 = local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_209 == true) {
        iVar12 = 0;
        pGVar14 = local_170;
        do {
          iVar4 = SDL_GetTicks();
          local_148.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_148.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_158.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_158.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          Mycontroller::HandleInput(&local_209,&local_148,&local_158);
          if (local_158.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_158.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          if (local_148.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          bVar3 = Car::isActive(local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
          if ((!bVar3) &&
             (bVar3 = Car::isActive(local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr), !bVar3)) {
            bVar3 = Car::get_success(local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
            ptVar10 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ptVar2 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                     .super__Vector_impl_data._M_finish;
            if ((bVar3) &&
               (bVar3 = Car::get_success(local_1e0.
                                         super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               , ptVar10 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start,
               ptVar2 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish, bVar3)) {
              local_209 = false;
              pGVar14->score = (pGVar14->score + 1) * (int)local_178;
              for (pOVar8 = local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pOVar8 != local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>.
                            _M_impl.super__Vector_impl_data._M_finish; pOVar8 = pOVar8 + 1) {
                pOVar8->_active = false;
              }
            }
            else {
              for (; ptVar10 != ptVar2; ptVar10 = ptVar10 + 1) {
                std::thread::join();
              }
              Car::set_xpos(local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,500
                           );
              pGVar14 = local_170;
              Car::set_ypos(local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,500
                           );
              Car::set_xpos(local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            0x1c2);
              Car::set_ypos(local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,600
                           );
              Car::set_active(local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              true);
              Car::set_active(local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              true);
              ptVar2 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -1;
              if ((local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1]._M_id._M_thread != 0) ||
                 (ptVar2 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_finish + -2,
                 local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish[-2]._M_id._M_thread != 0)) goto LAB_0010486c;
              local_200._M_id._M_thread = (id)Car::move;
              local_1f8 = (char *)0x0;
              local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish + -2;
              std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
                        (&local_208,(offset_in_Car_to_subr *)&local_200,&local_1d0);
              std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                        (&local_1b8,&local_208);
              ptVar2 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              if (local_208._M_id._M_thread != 0) goto LAB_0010486c;
              local_200._M_id._M_thread = (id)Car::move;
              local_1f8 = (char *)0x0;
              std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
                        (&local_208,(offset_in_Car_to_subr *)&local_200,&local_1e0);
              std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                        (&local_1b8,&local_208);
              ptVar2 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              if (local_208._M_id._M_thread != 0) goto LAB_0010486c;
            }
          }
          std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
                    (&local_60,&local_78);
          Renderer::Render(local_160,&local_198,&local_60);
          std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector
                    (&local_60);
          iVar5 = SDL_GetTicks();
          iVar12 = iVar12 + 1;
          if (999 < (uint)(iVar5 - local_1bc)) {
            Renderer::UpdateWindowTitle(local_160,pGVar14->score,iVar12);
            iVar12 = 0;
            local_1bc = iVar5;
          }
          if ((uint)(iVar5 - iVar4) < local_168) {
            SDL_Delay((int)local_168 - (iVar5 - iVar4));
          }
          pOVar8 = local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (local_209 != false);
      }
      for (; ptVar2 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
          pOVar8 != local_198.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                    super__Vector_impl_data._M_finish; pOVar8 = pOVar8 + 1) {
        pOVar8->_active = false;
      }
      (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_active = false;
      (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_active = false;
      for (ptVar10 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                     .super__Vector_impl_data._M_start; _Var1._M_pi = _Stack_110._M_pi,
          auVar11 = local_118, ptVar10 != ptVar2; ptVar10 = ptVar10 + 1) {
        std::thread::join();
      }
      for (; auVar11 != (undefined1  [8])_Var1._M_pi;
          auVar11 = (undefined1  [8])&((element_type *)auVar11)->_delay) {
        std::thread::join();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_118);
      std::vector<Obstacle,_std::allocator<Obstacle>_>::~vector(&local_198);
      std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector(&local_78);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_1b8);
      if (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      return;
    }
  }
LAB_0010486c:
  local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = ptVar2;
  std::terminate();
}

Assistant:

void Game::Run( Renderer &renderer,
               std::size_t target_frame_duration, int level) {
  Uint32 title_timestamp = SDL_GetTicks();
  Uint32 frame_start;
  Uint32 frame_end;
  Uint32 frame_duration;
  int frame_count = 0;
  bool running = true;


//---------Cars ---------------
  std::shared_ptr<Car> car1( new Car {470, 510, 640,-1, "horizontal"});
  std::shared_ptr<Car> car2 (new Car {605, 515, 640, -1, "vertical"});

  std::vector<std::thread> cars ;
  cars.emplace_back(std::thread(&Car::move, car1));
  cars.emplace_back(std::thread(&Car::move, car2));
  std::vector<std::shared_ptr<Car>> carObjects {car1,car2};
//-------------------------------



//--------Obstacles --------------
  std::vector<Obstacle> obstacles;

  for( int i = 0 ; i < level * 3; i++){
    int x = Randomizer::genRand(1,600);
    int y = Randomizer::genRand(1,600);
    int d = Randomizer::genRand(1,2);
    std::string direction = "vertical";

    if(d==1){
      direction = "horizontal";
    }
    //creating more obstacles (in every level)
    Obstacle obstacle {x,y, 600,1,direction,carObjects};
    obstacles.emplace_back(std::move(obstacle));
  }
  std::vector<std::thread> obstacleThreads;

  for ( auto& o : obstacles){
    obstacleThreads.emplace_back(std::thread(&Obstacle::move,&o));
  }
//-------------------------------



  while (running) {
    frame_start = SDL_GetTicks();

    // Input, [Update,] Render - the main game loop.
    //notice that the controller is automatically updating the object positions
    //so no need to create a method update()
    Mycontroller::HandleInput(running,car1,car2);

    
  // if cars are deactivated, then either reset or move to a new level
    if(car1->isActive()==false && car2->isActive() ==false){
       if(car1->get_success()==true && car2->get_success() ==true){
          running = false;
          score++;
          score *= level;
          for(auto& o : obstacles){
            o.deactivate();
          }
      }else{

      for(auto& c : cars){
        //std::cout <<"trying to join\n"<<std::endl;
        c.join();
        //std::cout <<"success  join\n"<<std::endl;
      }

      car1->set_xpos(500);
      car1->set_ypos(500);
      car2->set_xpos(450);
      car2->set_ypos(600);
      car1->set_active(true);
      car2->set_active(true);
       
      cars.pop_back();
      cars.pop_back();
       
      cars.emplace_back(std::thread(&Car::move, car1));
      cars.emplace_back(std::thread(&Car::move, car2));
      }

    }

    
    renderer.Render(obstacles, carObjects);

    frame_end = SDL_GetTicks();

    // Keep track of how long each loop through the input/update/render cycle
    // takes.
    frame_count++;
    frame_duration = frame_end - frame_start;

    // After every second, update the window title.
    if (frame_end - title_timestamp >= 1000) {
      renderer.UpdateWindowTitle(score, frame_count);
      frame_count = 0;
      title_timestamp = frame_end;
    }

    // If the time for this frame is too small (i.e. frame_duration is
    // smaller than the target ms_per_frame), delay the loop to
    // achieve the correct frame rate.
    if (frame_duration < target_frame_duration) {
      SDL_Delay(target_frame_duration - frame_duration);
    }
  }


// make sure that all threads will stop and join
  for(auto& o : obstacles){
    o.deactivate();
  }
  
  car1->deactivate();
  car2->deactivate();

for( auto& t : cars){
  t.join();
}

for(auto& t : obstacleThreads){
  t.join();
}
}